

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended-kalman-filter.cpp
# Opt level: O2

MeasureVector __thiscall
stateObservation::ExtendedKalmanFilter::predictSensor_(ExtendedKalmanFilter *this,TimeIndex k)

{
  IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *this_00;
  TimeIndex TVar1;
  long in_RDX;
  Index extraout_RDX;
  MeasureVector MVar2;
  Matrix<double,__1,_1,_0,__1,_1> local_38;
  
  this_00 = (IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)(k + 0x1a0);
  if (*(char *)(k + 0x1a0) == '\x01') {
    TVar1 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(this_00);
    if (TVar1 == in_RDX) goto LAB_00140772;
  }
  IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::check_
            ((IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)(k + 0x180));
  (**(code **)(*(long *)k + 0x220))(&local_38,k,k + 400);
  IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::set(this_00,&local_38,in_RDX);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
LAB_00140772:
  IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::check_(this_00);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,
             (DenseStorage<double,__1,__1,_1,_0> *)(k + 0x1b0));
  MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (MeasureVector)
         MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ObserverBase::MeasureVector ExtendedKalmanFilter::predictSensor_(TimeIndex k)
{

  if(!this->ybar_.isSet() || this->ybar_.getTime() != k)
  {
    ybar_.set(simulateSensor_(xbar_(), k), k);
  }

  return ybar_();
}